

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O3

bool __thiscall InterCode::doArith(InterCode *this)

{
  int iVar1;
  int iVar2;
  char *__nptr;
  int iVar3;
  int iVar4;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  char local_48 [16];
  int local_38;
  
  iVar1 = this->kind;
  iVar3 = 0;
  if (3 < iVar1 - 1U) goto LAB_001095a3;
  iVar2 = (this->arg1).kind;
  if (iVar2 == 2) {
    iVar3 = atoi((this->arg1).value._M_dataplus._M_p);
  }
  iVar4 = (this->arg2).kind;
  if (iVar4 == 2) {
    __nptr = (this->arg2).value._M_dataplus._M_p;
    iVar4 = atoi(__nptr);
    if (iVar2 != 2) {
      if (iVar4 == 0) {
        if (iVar1 - 1U < 2) {
          this->kind = 5;
LAB_001094d5:
          (this->arg2).kind = 0;
          (this->arg2).value._M_string_length = 0;
          *(this->arg2).value._M_dataplus._M_p = '\0';
        }
        else if (iVar1 == 3) goto LAB_00109563;
      }
LAB_001095a1:
      iVar3 = 0;
      goto LAB_001095a3;
    }
    if (iVar1 == 3) {
      iVar4 = iVar4 * iVar3;
    }
    else if (iVar1 == 2) {
      iVar4 = iVar3 - iVar4;
    }
    else if (iVar1 == 1) {
      iVar4 = iVar4 + iVar3;
    }
    else {
      iVar4 = iVar3 / iVar4;
    }
    (this->arg2).kind = 0;
    (this->arg2).value._M_string_length = 0;
    *__nptr = '\0';
    Operand::Operand((Operand *)local_60,iVar4);
    (this->arg1).kind = local_60._0_4_;
    std::__cxx11::string::operator=((string *)&(this->arg1).value,(string *)&local_58);
    (this->arg1).active = local_38;
    if (local_58._M_p != local_48) {
      operator_delete(local_58._M_p);
    }
  }
  else if (iVar1 != 2 || iVar4 != 0) {
    if (iVar2 == 2 && iVar3 == 0) {
      if (iVar1 - 3U < 2) {
LAB_00109563:
        this->kind = 5;
        (this->arg2).kind = 0;
        (this->arg2).value._M_string_length = 0;
        *(this->arg2).value._M_dataplus._M_p = '\0';
        (this->arg1).kind = OP_ZERO.kind;
        std::__cxx11::string::_M_assign((string *)&(this->arg1).value);
        (this->arg1).active = OP_ZERO.active;
      }
      else if (iVar1 == 1) {
        this->kind = 5;
        (this->arg1).kind = iVar4;
        std::__cxx11::string::_M_assign((string *)&(this->arg1).value);
        (this->arg1).active = (this->arg2).active;
        goto LAB_001094d5;
      }
    }
    goto LAB_001095a1;
  }
  this->kind = 5;
  iVar3 = 1;
LAB_001095a3:
  return SUB41(iVar3,0);
}

Assistant:

bool InterCode::doArith() {
    if (kind >= IC_ADD && kind <= IC_DIV) {
        int a1 = 0, a2 = 0;
        bool isA1 = arg1.getInt(a1), isA2 = arg2.getInt(a2);
        if (arg2.kind == IR_NONE && kind == IC_SUB) {
            a1 = -a1;
            kind = IC_ASSIGN;
            return true;
        }
        else if (isA1 && isA2) {
            switch (kind) {
                case IC_ADD: a1 += a2; break;
                case IC_SUB: a1 -= a2; break;
                case IC_MUL: a1 *= a2; break;
                default:     a1 /= a2;
            }
            arg2.clear();
            arg1 = Operand(a1);
            kind = IC_ASSIGN;
            return true;
        }
        else if (isA1 || isA2) {
            if (isA1 && a1 == 0) {
                if (kind == IC_MUL || kind == IC_DIV) {
                    kind = IC_ASSIGN;
                    arg2.clear();
                    arg1 = OP_ZERO;
                }
                else if (kind == IC_ADD) {
                    kind = IC_ASSIGN;
                    arg1 = arg2;
                    arg2.clear();
                }
            }
            else if (isA2 && a2 == 0) {
                if (kind == IC_MUL) {
                    kind = IC_ASSIGN;
                    arg2.clear();
                    arg1 = OP_ZERO;
                }
                else if (kind == IC_ADD || kind == IC_SUB) {
                    kind = IC_ASSIGN;
                    arg2.clear();
                }
            }
        }
    }
    return false;
}